

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DARKEN_AREA(effect_handler_context_t_conflict *context)

{
  short sVar1;
  player *p;
  _Bool _Var2;
  uint32_t uVar3;
  monster *mon;
  loc grid2;
  monster *mon_00;
  long lVar4;
  byte bVar5;
  player_state_conflict *ppVar6;
  char *fmt;
  undefined1 *puVar7;
  loc grid;
  bool bVar8;
  byte bVar9;
  player_state_conflict in_stack_fffffffffffffe28;
  char m_name [80];
  
  bVar9 = 0;
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  sVar1 = player->timed[2];
  bVar8 = sVar1 == 0;
  mon = monster_target_monster(context);
  grid2 = cave_find_decoy(cave);
  if ((context->origin).what == SRC_MONSTER) {
    mon_00 = cave_monster(cave,(context->origin).which.grid.x);
  }
  else {
    mon_00 = (monster *)0x0;
  }
  if (mon != (monster *)0x0) {
    grid.x = (mon->grid).x;
    grid.y = (mon->grid).y;
    monster_desc(m_name,0x50,mon,L'\x15');
    if (sVar1 == 0) {
      msg("Darkness surrounds %s.");
    }
    bVar8 = false;
  }
  if ((mon_00 == (monster *)0x0) || (_Var2 = monster_is_decoyed(mon_00), !_Var2)) {
    bVar5 = 0;
    if (!bVar8) goto LAB_0013f2f1;
    fmt = "Darkness surrounds you.";
    bVar5 = 0;
  }
  else {
    _Var2 = los(cave,player->grid,(loc_conflict)grid2);
    if ((_Var2) && (player->timed[2] == 0)) {
      bVar5 = 0;
    }
    else {
      bVar5 = 1;
    }
    grid = grid2;
    if (!bVar8) goto LAB_0013f2f1;
    fmt = "Darkness surrounds the decoy.";
    if (bVar5 != 0) {
      fmt = "Darkness surrounds you.";
    }
  }
  msg(fmt);
LAB_0013f2f1:
  light_room(grid,false);
  if ((context->origin).what == SRC_PLAYER) {
    ppVar6 = &player->state;
    puVar7 = &stack0xfffffffffffffe28;
    for (lVar4 = 0x13c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = (char)ppVar6->stat_add[0];
      ppVar6 = (player_state_conflict *)((long)ppVar6 + (ulong)bVar9 * -2 + 1);
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    _Var2 = player_resists_effects(in_stack_fffffffffffffe28,L'\x06');
    p = player;
    if (!_Var2) {
      uVar3 = Rand_div(5);
      player_inc_timed(p,L'\x02',uVar3 + L'\x04',true,(_Bool)(context->aware ^ 1),true);
    }
  }
  context->ident = (_Bool)(bVar5 ^ 1);
  return true;
}

Assistant:

bool effect_handler_DARKEN_AREA(effect_handler_context_t *context)
{
	struct loc target = player->grid;
	bool message = player->timed[TMD_BLIND] ? false : true;
	struct monster *mon = NULL;
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);
	bool decoy_unseen = false;

	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
	}

	/* Check for monster targeting another monster */
	if (t_mon) {
		char m_name[80];
		target = t_mon->grid;
		monster_desc(m_name, sizeof(m_name), t_mon, MDESC_TARG);
		if (message) {
			msg("Darkness surrounds %s.", m_name);
			message = false;
		}
	}

	/* Check for decoy */
	if (mon && monster_is_decoyed(mon)) {
		target = decoy;
		if (!los(cave, player->grid, decoy) ||
			player->timed[TMD_BLIND]) {
			decoy_unseen = true;
		}
		if (message && !decoy_unseen) {
			msg("Darkness surrounds the decoy.");
			message = false;
		}
	}

	if (message) {
		msg("Darkness surrounds you.");
	}

	/* Darken the room */
	light_room(target, false);

	/* Hack - blind the player directly if player-cast */
	if (context->origin.what == SRC_PLAYER &&
		!player_resists_effects(player->state, ELEM_DARK)) {
		(void)player_inc_timed(player, TMD_BLIND, 3 + randint1(5), true,
							   !context->aware, true);
	}

	/* Assume seen */
	context->ident = !decoy_unseen;
	return (true);
}